

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O3

size_t __thiscall DObject::PointerSubstitution(DObject *this,DObject *old,DObject *notOld)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  size_t *psVar3;
  size_t sVar4;
  PClass *this_00;
  
  this_00 = this->Class;
  if (this_00 == (PClass *)0x0) {
    iVar1 = (**this->_vptr_DObject)(this);
    this_00 = (PClass *)CONCAT44(extraout_var,iVar1);
    this->Class = this_00;
  }
  psVar3 = this_00->FlatPointers;
  if (psVar3 == (size_t *)0x0) {
    PClass::BuildFlatPointers(this_00);
    psVar3 = this_00->FlatPointers;
  }
  sVar4 = *psVar3;
  if (sVar4 == 0xffffffffffffffff) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      psVar3 = psVar3 + 1;
      if (*(DObject **)((long)&this->_vptr_DObject + sVar4) == old) {
        *(DObject **)((long)&this->_vptr_DObject + sVar4) = notOld;
        sVar2 = sVar2 + 1;
      }
      sVar4 = *psVar3;
    } while (sVar4 != 0xffffffffffffffff);
  }
  return sVar2;
}

Assistant:

size_t DObject::PointerSubstitution (DObject *old, DObject *notOld)
{
	const PClass *info = GetClass();
	const size_t *offsets = info->FlatPointers;
	size_t changed = 0;
	if (offsets == NULL)
	{
		const_cast<PClass *>(info)->BuildFlatPointers();
		offsets = info->FlatPointers;
	}
	while (*offsets != ~(size_t)0)
	{
		if (*(DObject **)((BYTE *)this + *offsets) == old)
		{
			*(DObject **)((BYTE *)this + *offsets) = notOld;
			changed++;
		}
		offsets++;
	}
	return changed;
}